

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O3

int ToffoliGateCount(int controls,int lines)

{
  int iVar1;
  
  switch(controls) {
  case 0:
  case 1:
    return 0;
  case 2:
    return 1;
  case 3:
    return 4;
  case 4:
    return (uint)(lines < 7) * 2 + 8;
  }
  iVar1 = controls * 8 + -0x18;
  if (controls <= (lines - (lines + 1 >> 0x1f)) + 1 >> 1) {
    iVar1 = controls * 4 + -8;
  }
  return iVar1;
}

Assistant:

int ToffoliGateCount( int controls, int lines )
{
    switch ( controls )
    {
    case 0u:
    case 1u:
        return 0;
        break;
    case 2u:
        return 1;
        break;
    case 3u:
        return 4;
        break;
    case 4u:
        return ( ( ( lines + 1 ) / 2 ) >= controls ) ? 8 : 10;
        break;
    default:
        return ( ( ( lines + 1 ) / 2 ) >= controls ) ? 4 * ( controls - 2 ) : 8 * ( controls - 3 );
    }
}